

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

bool Diligent::VerifyTLASResourceBinding<Diligent::TopLevelASVkImpl>
               (PipelineResourceDesc *ResDesc,BindResourceInfo *BindInfo,TopLevelASVkImpl *pTLASImpl
               ,IDeviceObject *pCachedAS,char *SignatureName)

{
  bool bVar1;
  Char *Message;
  undefined1 local_50 [8];
  string msg;
  char *SignatureName_local;
  IDeviceObject *pCachedAS_local;
  TopLevelASVkImpl *pTLASImpl_local;
  BindResourceInfo *BindInfo_local;
  PipelineResourceDesc *ResDesc_local;
  
  msg.field_2._8_8_ = SignatureName;
  if ((BindInfo->BufferBaseOffset != 0) || (BindInfo->BufferRangeSize != 0)) {
    FormatString<char[42]>
              ((string *)local_50,(char (*) [42])"Buffer range can\'t be specified for TLAS.");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"VerifyTLASResourceBinding",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x211);
    std::__cxx11::string::~string((string *)local_50);
  }
  bVar1 = VerifyResourceBinding<Diligent::TopLevelASVkImpl>
                    ("TLAS",ResDesc,BindInfo,pTLASImpl,pCachedAS,(char *)msg.field_2._8_8_);
  return bVar1;
}

Assistant:

bool VerifyTLASResourceBinding(const PipelineResourceDesc& ResDesc,
                               const BindResourceInfo&     BindInfo,
                               const TLASImplType*         pTLASImpl,
                               const IDeviceObject*        pCachedAS,
                               const char*                 SignatureName)
{
    if (BindInfo.BufferBaseOffset != 0 || BindInfo.BufferRangeSize != 0)
    {
        RESOURCE_VALIDATION_FAILURE("Buffer range can't be specified for TLAS.");
    }
    return VerifyResourceBinding("TLAS", ResDesc, BindInfo, pTLASImpl, pCachedAS, SignatureName);
}